

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded
          (CumulativeReporterBase<Catch::JunitReporter> *this,TestCaseStats *testCaseStats)

{
  element_type *peVar1;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  node;
  element_type *local_28;
  
  std::
  make_shared<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,Catch::TestCaseStats_const&>
            ((TestCaseStats *)&stack0xffffffffffffffd8);
  if ((this->m_sectionStack).
      super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_sectionStack).
      super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("m_sectionStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp"
                  ,0x1725,
                  "virtual void Catch::CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded(const TestCaseStats &) [DerivedT = Catch::JunitReporter]"
                 );
  }
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::push_back(&local_28->children,&this->m_rootSection);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  ::push_back(&this->m_testCases,(value_type *)&stack0xffffffffffffffd8);
  clara::std::
  __shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  ::reset(&(this->m_rootSection).
           super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
         );
  peVar1 = (this->m_deepestSection).
           super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)&peVar1->stdOut);
    std::__cxx11::string::_M_assign
              ((string *)
               &((this->m_deepestSection).
                 super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->stdErr);
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    return;
  }
  __assert_fail("m_deepestSection",
                "/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp"
                ,0x172a,
                "virtual void Catch::CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded(const TestCaseStats &) [DerivedT = Catch::JunitReporter]"
               );
}

Assistant:

void testCaseEnded(TestCaseStats const& testCaseStats) override {
            auto node = std::make_shared<TestCaseNode>(testCaseStats);
            assert(m_sectionStack.size() == 0);
            node->children.push_back(m_rootSection);
            m_testCases.push_back(node);
            m_rootSection.reset();

            assert(m_deepestSection);
            m_deepestSection->stdOut = testCaseStats.stdOut;
            m_deepestSection->stdErr = testCaseStats.stdErr;
        }